

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O1

WeightedIsomapAveraging * __thiscall
WeightedIsomapAveraging::add_and_merge(WeightedIsomapAveraging *this,Mat *isomap)

{
  Mat MVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  long in_RDX;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  Mat *merged_isomap_uchar;
  undefined4 local_48 [2];
  WeightedIsomapAveraging *local_40;
  undefined8 uStack_38;
  
  if (0 < *(int *)(in_RDX + 8)) {
    lVar2 = *(long *)(in_RDX + 0x10);
    plVar3 = *(long **)(in_RDX + 0x48);
    MVar1 = isomap[0xc0];
    lVar9 = 0;
    do {
      if (0 < *(int *)(in_RDX + 0xc)) {
        lVar10 = *plVar3 * lVar9 + lVar2 + 3;
        plVar4 = *(long **)(isomap + 0xa8);
        lVar5 = *(long *)(isomap + 0x10);
        plVar6 = *(long **)(isomap + 0x48);
        lVar11 = *(long *)(isomap + 0x70) + 8;
        lVar12 = 0;
        do {
          if ((byte)MVar1 < (byte)*(Mat *)(lVar10 + lVar12 * 4)) {
            lVar13 = *plVar6 * lVar9 + lVar5;
            iVar8 = *(int *)(lVar13 + lVar12 * 4);
            fVar14 = (float)iVar8;
            lVar7 = *plVar4 * lVar9;
            iVar8 = iVar8 + 1;
            fVar15 = (float)iVar8;
            *(float *)(lVar11 + -8 + lVar7) =
                 (*(float *)(lVar11 + -8 + lVar7) * fVar14 +
                 (float)*(byte *)(lVar10 + -3 + lVar12 * 4)) / fVar15;
            *(float *)(lVar11 + -4 + lVar7) =
                 (*(float *)(lVar11 + -4 + lVar7) * fVar14 +
                 (float)*(byte *)(lVar10 + -2 + lVar12 * 4)) / fVar15;
            *(float *)(lVar11 + lVar7) =
                 (fVar14 * *(float *)(lVar11 + lVar7) + (float)*(byte *)(lVar10 + -1 + lVar12 * 4))
                 / fVar15;
            *(undefined4 *)(lVar11 + 4 + lVar7) = 0x437f0000;
            *(int *)(lVar13 + lVar12 * 4) = iVar8;
          }
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 0x10;
        } while (lVar12 < *(int *)(in_RDX + 0xc));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(in_RDX + 8));
  }
  cv::Mat::Mat(&this->visibility_counter);
  uStack_38 = 0;
  local_48[0] = 0x2010000;
  local_40 = this;
  cv::Mat::convertTo((_OutputArray *)(isomap + 0x60),(int)local_48,1.0,0.0);
  return this;
}

Assistant:

cv::Mat add_and_merge(const cv::Mat& isomap)
    {
        // Merge isomaps, add the current to the already merged, pixel by pixel:
        for (int r = 0; r < isomap.rows; ++r)
        {
            for (int c = 0; c < isomap.cols; ++c)
            {
                if (isomap.at<cv::Vec4b>(r, c)[3] <= threshold)
                {
                    continue; // ignore this pixel, not visible in the extracted isomap of this current frame
                }
                // we're sure to have a visible pixel, merge it:
                // merged_pixel = (old_average * visible_count + new_pixel) / (visible_count + 1)
                merged_isomap.at<cv::Vec4f>(r, c)[0] = (merged_isomap.at<cv::Vec4f>(r, c)[0] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[0]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[1] = (merged_isomap.at<cv::Vec4f>(r, c)[1] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[1]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[2] = (merged_isomap.at<cv::Vec4f>(r, c)[2] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[2]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[3] = 255; // as soon as we've seen the pixel visible once, we set it to visible.
                ++visibility_counter.at<int>(r, c);
            }
        }
        cv::Mat merged_isomap_uchar;
        merged_isomap.convertTo(merged_isomap_uchar, CV_8UC4);
        return merged_isomap_uchar;
    }